

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O3

bool __thiscall
pbrt::DisplayItem::ImageChannelBuffer::SendIfChanged
          (ImageChannelBuffer *this,IPCChannel *ipcChannel,int tileIndex)

{
  int iVar1;
  pointer puVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  span<const_unsigned_char> message;
  
  iVar1 = this->setCount;
  if (0x4000 < (long)iVar1) {
    memset((this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + (long)iVar1 * 4 + (long)this->channelValuesOffset,0,
           (ulong)(iVar1 - 0x4000) << 2);
  }
  puVar2 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0xa7935bd1e9950000;
  lVar7 = 0;
  do {
    lVar3 = lVar7 + this->channelValuesOffset;
    lVar7 = lVar7 + 8;
    uVar8 = *(long *)(puVar2 + lVar3) * -0x395b586ca42e166b;
    uVar5 = (uVar5 ^ (uVar8 >> 0x2f ^ uVar8) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
  } while (lVar7 != 0x10000);
  bVar6 = true;
  uVar5 = (uVar5 >> 0x2f ^ uVar5) * -0x395b586ca42e166b;
  uVar5 = uVar5 >> 0x2f ^ uVar5;
  if (uVar5 != (this->tileHashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[tileIndex]) {
    message.n = (long)this->channelValuesOffset + (long)this->setCount * 4;
    message.ptr = puVar2;
    bVar4 = IPCChannel::Send(ipcChannel,message);
    if (bVar4) {
      (this->tileHashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[tileIndex] = uVar5;
    }
    else {
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool DisplayItem::ImageChannelBuffer::SendIfChanged(IPCChannel &ipcChannel,
                                                    int tileIndex) {
    int excess = setCount - tileSize * tileSize;
    if (excess > 0)
        memset(buffer.data() + channelValuesOffset + setCount * sizeof(float), 0,
               excess * sizeof(float));

    uint64_t hash = HashBuffer(buffer.data() + channelValuesOffset,
                               tileSize * tileSize * sizeof(float));
    if (hash == tileHashes[tileIndex])
        return true;

    if (!ipcChannel.Send(pstd::MakeSpan(buffer.data(),
                                        channelValuesOffset + setCount * sizeof(float))))
        return false;

    tileHashes[tileIndex] = hash;
    return true;
}